

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.cpp
# Opt level: O3

void __thiscall KDIS::KDataStream::ReadFromString(KDataStream *this,KString *S)

{
  pointer *ppuVar1;
  iterator __position;
  istream *piVar2;
  KUINT8 o;
  KStringStream ss;
  uchar local_1a9;
  long local_1a8 [3];
  uint auStack_190 [26];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8,(string *)S,_S_out|_S_in);
  while( true ) {
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
    piVar2 = std::operator>>((istream *)local_1a8,(char *)&local_1a9);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    __position._M_current =
         (this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_vBuffer,__position,
                 &local_1a9);
    }
    else {
      *__position._M_current = local_1a9;
      ppuVar1 = &(this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void KDataStream::ReadFromString( const KString & S )
{
    KStringStream ss( S );

    KUINT8 o;
    while( ss >> hex >> o )
    {
        m_vBuffer.push_back( o );
    }
}